

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteConstBit(Bac_Ntk_t *p,int iObj,int fHead)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Vec_Str_t *pVVar4;
  size_t sVar5;
  char *pcVar6;
  char cVar7;
  int i;
  long lVar8;
  
  if ((-1 < iObj) && (uVar2 = (p->vType).nSize, iObj < (int)uVar2)) {
    pcVar6 = (p->vType).pArray;
    bVar1 = pcVar6[(uint)iObj];
    if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("Bac_ObjIsCi(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x12e,"int Bac_ObjGetConst(Bac_Ntk_t *, int)");
    }
    if ((bVar1 & 0xfe) == 8) {
      if (uVar2 <= iObj - 1U) goto LAB_003cd562;
      bVar1 = pcVar6[iObj - 1U];
      if (0xf7 < (byte)(bVar1 - 0x14)) {
        pVVar4 = p->pDesign->vOut;
        if (fHead != 0) {
          lVar8 = 0;
          do {
            cVar7 = "1\'b"[lVar8];
            uVar2 = pVVar4->nSize;
            if (uVar2 == pVVar4->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(0x10);
                }
                else {
                  pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar6;
                pVVar4->nCap = 0x10;
              }
              else {
                sVar5 = (ulong)uVar2 * 2;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(sVar5);
                }
                else {
                  pcVar6 = (char *)realloc(pVVar4->pArray,sVar5);
                }
                pVVar4->pArray = pcVar6;
                pVVar4->nCap = (int)sVar5;
              }
            }
            else {
              pcVar6 = pVVar4->pArray;
            }
            iVar3 = pVVar4->nSize;
            pVVar4->nSize = iVar3 + 1;
            pcVar6[iVar3] = cVar7;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
        }
        switch(bVar1 >> 1) {
        case 6:
          uVar2 = pVVar4->nSize;
          if (uVar2 == pVVar4->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar5 = (ulong)uVar2 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar5);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,sVar5);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = (int)sVar5;
            }
          }
          else {
            pcVar6 = pVVar4->pArray;
          }
          cVar7 = '0';
          break;
        case 7:
          uVar2 = pVVar4->nSize;
          if (uVar2 == pVVar4->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar5 = (ulong)uVar2 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar5);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,sVar5);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = (int)sVar5;
            }
          }
          else {
            pcVar6 = pVVar4->pArray;
          }
          cVar7 = '1';
          break;
        case 8:
          uVar2 = pVVar4->nSize;
          if (uVar2 == pVVar4->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar5 = (ulong)uVar2 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar5);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,sVar5);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = (int)sVar5;
            }
          }
          else {
            pcVar6 = pVVar4->pArray;
          }
          cVar7 = 'x';
          break;
        case 9:
          uVar2 = pVVar4->nSize;
          if (uVar2 == pVVar4->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = 0x10;
            }
            else {
              sVar5 = (ulong)uVar2 * 2;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar5);
              }
              else {
                pcVar6 = (char *)realloc(pVVar4->pArray,sVar5);
              }
              pVVar4->pArray = pcVar6;
              pVVar4->nCap = (int)sVar5;
            }
          }
          else {
            pcVar6 = pVVar4->pArray;
          }
          cVar7 = 'z';
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                        ,0xef,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
        }
        iVar3 = pVVar4->nSize;
        pVVar4->nSize = iVar3 + 1;
        pcVar6[iVar3] = cVar7;
        return;
      }
    }
    __assert_fail("Const",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xe4,"void Bac_ManWriteConstBit(Bac_Ntk_t *, int, int)");
  }
LAB_003cd562:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void Bac_ManWriteConstBit( Bac_Ntk_t * p, int iObj, int fHead )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int Const = Bac_ObjGetConst(p, iObj);
    assert( Const );
    if ( fHead )
        Vec_StrPrintStr( vStr, "1\'b" );
    if ( Const == BAC_BOX_CF )
        Vec_StrPush( vStr, '0' );
    else if ( Const == BAC_BOX_CT )
        Vec_StrPush( vStr, '1' );
    else if ( Const == BAC_BOX_CX )
        Vec_StrPush( vStr, 'x' );
    else if ( Const == BAC_BOX_CZ )
        Vec_StrPush( vStr, 'z' );
    else assert( 0 );
}